

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

void __thiscall gutil::Parameter::addParamDef(Parameter *this,char **pdef)

{
  long lVar1;
  long in_RSI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  string s;
  int i;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  value_type *__x;
  allocator *this_00;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while (*(long *)(local_10 + (long)local_14 * 8) != 0) {
    __x = *(value_type **)(local_10 + (long)local_14 * 8);
    this_00 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,(char *)__x,this_00);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58._M_node);
    anon_unknown_3::getValue(in_stack_ffffffffffffff98);
    std::__cxx11::string::operator=(local_38,local_70);
    std::__cxx11::string::~string(local_70);
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      in_stack_ffffffffffffff60 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*(char *)&(in_stack_ffffffffffffff60->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == '-') {
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00,__x);
        in_stack_ffffffffffffff58 = pVar2.first._M_node;
      }
    }
    std::__cxx11::string::~string(local_38);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Parameter::addParamDef(const char *pdef[])
{
  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }
}